

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aacStreamReader.cpp
# Opt level: O1

string * __thiscall
AACStreamReader::getStreamInfo_abi_cxx11_(string *__return_storage_ptr__,AACStreamReader *this)

{
  ostream *poVar1;
  ostringstream str;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Sample Rate: ",0xd);
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)local_190,(this->super_AACCodec).m_sample_rate / 1000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"KHz  ",5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"Channels: ",10);
  std::ostream::operator<<((ostream *)local_190,(uint)(this->super_AACCodec).m_channels);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

const std::string AACStreamReader::getStreamInfo()
{
    std::ostringstream str;
    str << "Sample Rate: " << m_sample_rate / 1000 << "KHz  ";
    str << "Channels: " << static_cast<int>(m_channels);
    return str.str();
}